

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void disableTerm(WhereLevel *pLevel,WhereTerm *pTerm)

{
  bool bVar1;
  int nLoop;
  WhereTerm *pTerm_local;
  WhereLevel *pLevel_local;
  
  nLoop = 0;
  pTerm_local = pTerm;
  while( true ) {
    bVar1 = false;
    if (((pTerm_local->wtFlags & 4) == 0) &&
       ((pLevel->iLeftJoin == 0 || (bVar1 = false, (pTerm_local->pExpr->flags & 1) != 0)))) {
      bVar1 = (pLevel->notReady & pTerm_local->prereqAll) == 0;
    }
    if (!bVar1) break;
    if ((nLoop == 0) || ((pTerm_local->wtFlags & 0x400) == 0)) {
      pTerm_local->wtFlags = pTerm_local->wtFlags | 4;
    }
    else {
      pTerm_local->wtFlags = pTerm_local->wtFlags | 0x200;
    }
    if (pTerm_local->iParent < 0) {
      return;
    }
    pTerm_local = pTerm_local->pWC->a + pTerm_local->iParent;
    pTerm_local->nChild = pTerm_local->nChild + 0xff;
    if (pTerm_local->nChild != '\0') {
      return;
    }
    nLoop = nLoop + 1;
  }
  return;
}

Assistant:

static void disableTerm(WhereLevel *pLevel, WhereTerm *pTerm){
  int nLoop = 0;
  assert( pTerm!=0 );
  while( (pTerm->wtFlags & TERM_CODED)==0
      && (pLevel->iLeftJoin==0 || ExprHasProperty(pTerm->pExpr, EP_OuterON))
      && (pLevel->notReady & pTerm->prereqAll)==0
  ){
    if( nLoop && (pTerm->wtFlags & TERM_LIKE)!=0 ){
      pTerm->wtFlags |= TERM_LIKECOND;
    }else{
      pTerm->wtFlags |= TERM_CODED;
    }
#ifdef WHERETRACE_ENABLED
    if( (sqlite3WhereTrace & 0x4001)==0x4001 ){
      sqlite3DebugPrintf("DISABLE-");
      sqlite3WhereTermPrint(pTerm, (int)(pTerm - (pTerm->pWC->a)));
    }
#endif
    if( pTerm->iParent<0 ) break;
    pTerm = &pTerm->pWC->a[pTerm->iParent];
    assert( pTerm!=0 );
    pTerm->nChild--;
    if( pTerm->nChild!=0 ) break;
    nLoop++;
  }
}